

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O1

bool_t hexIsValid(char *hex)

{
  byte bVar1;
  bool_t bVar2;
  size_t sVar3;
  bool_t bVar4;
  byte *pbVar5;
  
  bVar2 = strIsValid(hex);
  bVar4 = 0;
  if ((bVar2 != 0) && (sVar3 = strLen(hex), bVar4 = 0, (sVar3 & 1) == 0)) {
    bVar1 = *hex;
    if (bVar1 != 0) {
      pbVar5 = (byte *)(hex + 1);
      do {
        if (hex_dec_table[bVar1] == 0xff) {
          return 0;
        }
        bVar1 = *pbVar5;
        pbVar5 = pbVar5 + 1;
      } while (bVar1 != 0);
    }
    bVar4 = 1;
  }
  return bVar4;
}

Assistant:

bool_t hexIsValid(const char* hex)
{
	if (!strIsValid(hex) || strLen(hex) % 2)
		return FALSE;
	for (; *hex; ++hex)
		if (hex_dec_table[(octet)*hex] == 0xFF)
			return FALSE;
	return TRUE;
}